

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O1

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  uint uVar1;
  iterator iVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  pthread_mutex_t *__mutex;
  ulong uVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  size_type __n;
  double __x;
  double dVar10;
  double dVar11;
  double u2;
  double local_68;
  double local_60;
  pthread_mutex_t *local_58;
  double local_50;
  long local_48;
  ulong local_40;
  double local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_mutex;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 == 0) {
    if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
        this->m_max_refinements) {
      LOCK();
      (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
           (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      uVar1 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
      uVar8 = (ulong)uVar1;
      __x = ldexp(1.0,-uVar1);
      local_50 = __x + __x;
      dVar10 = ceil((this->m_t_max - __x) / local_50);
      dVar11 = dVar10;
      local_58 = __mutex;
      if (0x7fefffffffffffff < (ulong)ABS(dVar10)) {
        local_68 = dVar10;
        policies::detail::raise_error<boost::math::rounding_error,double>
                  ("boost::math::trunc<%1%>(%1%)",
                   "Value %1% can not be represented in the target integer type.",&local_68);
        dVar11 = 0.0;
      }
      if ((2147483647.0 < dVar11) || (dVar11 < -2147483648.0)) {
        local_68 = dVar10;
        policies::detail::raise_error<boost::math::rounding_error,double>
                  ("boost::math::itrunc<%1%>(%1%)",
                   "Value %1% can not be represented in the target integer type.",&local_68);
        __n = 0;
      }
      else {
        __n = (size_type)(int)dVar11;
      }
      std::vector<double,_std::allocator<double>_>::reserve
                ((this->m_abscissas).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
      std::vector<double,_std::allocator<double>_>::reserve
                ((this->m_weights).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
      dVar11 = this->m_t_max;
      uVar7 = 0;
      local_48 = uVar8 * 3;
      local_40 = uVar8;
      for (dVar10 = __x; lVar4 = local_48, __mutex = local_58, dVar10 < dVar11;
          dVar10 = dVar10 + local_50) {
        local_60 = this->m_t_crossover;
        bVar3 = dVar10 < local_60;
        pvVar9 = (this->m_abscissas).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8;
        dVar11 = sinh(dVar10);
        dVar11 = dVar11 * 1.5707963267948966;
        if (local_60 <= dVar10) {
          local_38 = dVar11;
          local_60 = exp(dVar11);
          dVar11 = cosh(local_38);
          local_68 = -1.0 / (dVar11 * local_60);
        }
        else {
          local_68 = tanh(dVar11);
        }
        iVar2._M_current =
             (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (pvVar9,iVar2,&local_68);
        }
        else {
          *iVar2._M_current = local_68;
          (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar7 = uVar7 + bVar3;
        dVar11 = this->m_t_max;
      }
      (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[local_40] = uVar7;
      if (__x < this->m_t_max) {
        do {
          pvVar9 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(((this->m_weights).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8);
          dVar11 = sinh(__x);
          dVar11 = cosh(dVar11 * 1.5707963267948966);
          dVar10 = cosh(__x);
          local_68 = (dVar10 * 1.5707963267948966) / (dVar11 * dVar11);
          iVar2._M_current =
               (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar9,iVar2,&local_68);
          }
          else {
            *iVar2._M_current = local_68;
            (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          __x = __x + local_50;
        } while (__x < this->m_t_max);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar5);
  pthread_mutex_unlock(local_58);
  _Unwind_Resume(uVar6);
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }